

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

void ODDLParser::logMessage(LogSeverity severity,string *msg)

{
  string log;
  char *local_30;
  long local_28;
  char local_20;
  undefined7 uStack_1f;
  
  local_28 = 0;
  local_20 = '\0';
  local_30 = &local_20;
  std::__cxx11::string::append((char *)&local_30);
  std::__cxx11::string::_M_append((char *)&local_30,(ulong)(msg->_M_dataplus)._M_p);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_30,local_28);
  if (local_30 != &local_20) {
    operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
  }
  return;
}

Assistant:

static void logMessage( LogSeverity severity, const std::string &msg ) {
    std::string log;
    if( ddl_debug_msg == severity ) {
        log += "Debug:";
    } else if( ddl_info_msg == severity ) {
        log += "Info :";
    } else if( ddl_warn_msg == severity ) {
        log += "Warn :";
    } else if( ddl_error_msg == severity ) {
        log += "Error:";
    } else {
        log += "None :";
    }

    log += msg;
    std::cout << log;
}